

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

void __thiscall
util::ConstevalFormatString<129U>::Detail_CheckNumFormatSpecifiers
          (ConstevalFormatString<129U> *this,string_view str)

{
  long lVar1;
  uint uVar2;
  undefined8 *puVar3;
  uint uVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  byte bVar10;
  long in_FS_OFFSET;
  
  pbVar6 = (byte *)str._M_str;
  pbVar7 = (byte *)str._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)this < 1) {
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    pbVar9 = pbVar7 + (long)&this->fmt;
    uVar2 = 0;
    uVar4 = 0;
    pbVar6 = pbVar7;
LAB_006eccc0:
    do {
      pbVar7 = pbVar6 + 1;
      if (*pbVar6 == 0x25) {
        if (pbVar9 <= pbVar7) {
LAB_006ecd79:
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_006ece17;
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          pcVar5 = "Format specifier incorrectly terminated by end of string";
          goto LAB_006ecd9d;
        }
        if (*pbVar7 != 0x25) {
          bVar10 = *pbVar7;
          uVar8 = 0;
          if ((byte)(bVar10 - 0x30) < 10) {
            uVar8 = 0;
            do {
              uVar8 = ((uint)bVar10 + uVar8 * 10) - 0x30;
              bVar10 = pbVar7[1];
              pbVar7 = pbVar7 + 1;
            } while ((byte)(bVar10 - 0x30) < 10);
          }
          if (bVar10 == 0x24) {
            if (uVar8 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_006ece17;
              puVar3 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "Positional format specifier must have position of at least 1";
              goto LAB_006ecd9d;
            }
            if (uVar8 < uVar4) {
              uVar8 = uVar4;
            }
            uVar4 = uVar8;
            if (pbVar9 <= pbVar7 + 1) goto LAB_006ecd79;
          }
          else {
            uVar2 = uVar2 + 1;
          }
          pbVar6 = pbVar7 + 1;
          pbVar7 = pbVar6;
          if (pbVar9 <= pbVar6) break;
          goto LAB_006eccc0;
        }
        pbVar7 = pbVar6 + 2;
      }
      pbVar6 = pbVar7;
      pbVar7 = pbVar6;
    } while (pbVar6 < pbVar9);
  }
  if ((uVar2 == 0) || (uVar4 == 0)) {
    if ((uVar2 | uVar4) == 0x81) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8,pbVar7,pbVar6);
      pcVar5 = "Format specifier count must match the argument count!";
      goto LAB_006ecd9d;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8,pbVar7,pbVar6);
    pcVar5 = "Format specifiers must be all positional or all non-positional!";
LAB_006ecd9d:
    *puVar3 = pcVar5;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
LAB_006ece17:
  __stack_chk_fail();
}

Assistant:

constexpr static void Detail_CheckNumFormatSpecifiers(std::string_view str)
    {
        unsigned count_normal{0}; // Number of "normal" specifiers, like %s
        unsigned count_pos{0};    // Max number in positional specifier, like %8$s
        for (auto it{str.begin()}; it < str.end();) {
            if (*it != '%') {
                ++it;
                continue;
            }

            if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            if (*it == '%') {
                // Percent escape: %%
                ++it;
                continue;
            }

            unsigned maybe_num{0};
            while ('0' <= *it && *it <= '9') {
                maybe_num *= 10;
                maybe_num += *it - '0';
                ++it;
            };

            if (*it == '$') {
                // Positional specifier, like %8$s
                if (maybe_num == 0) throw "Positional format specifier must have position of at least 1";
                count_pos = std::max(count_pos, maybe_num);
                if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            } else {
                // Non-positional specifier, like %s
                ++count_normal;
                ++it;
            }
            // The remainder "[flags][width][.precision][length]type" of the
            // specifier is not checked. Parsing continues with the next '%'.
        }
        if (count_normal && count_pos) throw "Format specifiers must be all positional or all non-positional!";
        unsigned count{count_normal | count_pos};
        if (num_params != count) throw "Format specifier count must match the argument count!";
    }